

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.h
# Opt level: O1

bool __thiscall
soul::Type::isValidArrayOrVectorRange<unsigned_long>
          (Type *this,unsigned_long start,unsigned_long end)

{
  bool bVar1;
  
  bVar1 = isValidArrayOrVectorIndex<unsigned_long>(this,start);
  if (bVar1) {
    bVar1 = isValidArrayOrVectorIndex<unsigned_long>(this,end);
    if (!bVar1) {
      if ((this->category & ~primitive) != vector) {
        throwInternalCompilerError("isArrayOrVector()","getArrayOrVectorSize",0x137);
      }
      if ((long)this->boundingSize != end) goto LAB_001c3042;
    }
    bVar1 = start < end;
  }
  else {
LAB_001c3042:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isValidArrayOrVectorRange (IntType start, IntType end) const
    {
        return isValidArrayOrVectorIndex (start)
                && (isValidArrayOrVectorIndex (end) || (ArraySize) end == getArrayOrVectorSize())
                && convertArrayOrVectorIndexToValidRange (start) < convertArrayOrVectorIndexToValidRange (end)
                && end != 0;
    }